

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.h
# Opt level: O0

void gen_uc_traceopcode(TCGContext_conflict9 *tcg_ctx,void *hook,TCGv_i64 arg1,TCGv_i64 arg2,
                       uint32_t size,void *uc,uint64_t pc)

{
  TCGv_i64 arg1_00;
  TCGv_i64 arg5;
  TCGv_i64 arg6;
  TCGv_i32 arg4;
  TCGv_i32 tsz;
  TCGv_i64 tpc;
  TCGv_ptr tuc;
  TCGv_ptr thook;
  void *uc_local;
  uint32_t size_local;
  TCGv_i64 arg2_local;
  TCGv_i64 arg1_local;
  void *hook_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg1_00 = tcg_const_i64_tricore(tcg_ctx,(int64_t)hook);
  arg5 = tcg_const_i64_tricore(tcg_ctx,(int64_t)uc);
  arg6 = tcg_const_i64_tricore(tcg_ctx,pc);
  arg4 = tcg_const_i32_tricore(tcg_ctx,size);
  gen_helper_uc_traceopcode(tcg_ctx,(TCGv_ptr)arg1_00,arg1,arg2,arg4,(TCGv_ptr)arg5,arg6);
  tcg_temp_free_i32(tcg_ctx,arg4);
  tcg_temp_free_i64(tcg_ctx,arg6);
  tcg_temp_free_ptr(tcg_ctx,(TCGv_ptr)arg5);
  tcg_temp_free_ptr(tcg_ctx,(TCGv_ptr)arg1_00);
  return;
}

Assistant:

static inline void gen_uc_traceopcode(TCGContext *tcg_ctx, void* hook, TCGv_i64 arg1, TCGv_i64 arg2, uint32_t size, void *uc, uint64_t pc)
{
    TCGv_ptr thook = tcg_const_ptr(tcg_ctx, hook);
    TCGv_ptr tuc = tcg_const_ptr(tcg_ctx, uc);
    TCGv_i64 tpc = tcg_const_i64(tcg_ctx, pc);
    TCGv_i32 tsz = tcg_const_i32(tcg_ctx, size);
// #if TARGET_LONG_BITS == 32
//     TCGv_i64 targ1 = temp_tcgv_i64(tcg_ctx, tcgv_i32_temp(tcg_ctx, arg1));
//     TCGv_i64 targ2 = temp_tcgv_i64(tcg_ctx, tcgv_i32_temp(tcg_ctx, arg2));
// #else
//     TCGv_i64 targ1 = arg1;
//     TCGv_i64 targ2 = arg2;
// #endif
    gen_helper_uc_traceopcode(tcg_ctx, thook, arg1, arg2, tsz, tuc, tpc);
    tcg_temp_free_i32(tcg_ctx, tsz);
    tcg_temp_free_i64(tcg_ctx, tpc);
    tcg_temp_free_ptr(tcg_ctx, tuc);
    tcg_temp_free_ptr(tcg_ctx, thook);
}